

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O2

void __thiscall hwnet::TCPSocket::sendInWorker(TCPSocket *this)

{
  mutex *__mutex;
  char cVar1;
  int iVar2;
  linklist *this_00;
  sendContext *psVar3;
  size_t sVar4;
  ulong uVar5;
  Poller *this_01;
  int iVar6;
  bool bVar7;
  size_t *psVar8;
  ssize_t sVar9;
  rep rVar10;
  int *piVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  linklist *plVar15;
  long local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  undefined1 auStack_c8 [8];
  FlushCallback flushCallback;
  ErrorCallback errorCallback;
  HighWaterCallback highWaterCallback;
  Ptr local_40;
  
  flushCallback.super__Function_base._M_functor._8_8_ = 0;
  flushCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  flushCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  errorCallback.super__Function_base._M_functor._8_8_ = 0;
  errorCallback.super__Function_base._M_manager = (_Manager_type)0x0;
  flushCallback._M_invoker = (_Invoker_type)0x0;
  errorCallback.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  errorCallback._M_invoker = (_Invoker_type)0x0;
  __mutex = &this->mtx;
  std::mutex::lock(__mutex);
  bVar7 = canWrite(this);
  if (!bVar7) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    goto LAB_0011b5c0;
  }
  if ((this->writeable == false) &&
     (this->highWaterSize < this->bytes4Send && this->highWaterSize != 0)) {
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)>::operator=
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_unsigned_long)> *)
               &errorCallback._M_invoker,&this->highWaterCallback_);
    iVar12 = 1;
    bVar7 = false;
    cVar1 = '\0';
  }
  else {
    this_00 = this->ptrSendlist;
    iVar2 = this->writeableVer;
    bVar7 = this->slistIdx == 0;
    this->slistIdx = (uint)bVar7;
    this->ptrSendlist = this->sendLists + bVar7;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    psVar8 = &this->send_iovec[0].iov_len;
    iVar12 = 0;
    plVar15 = this_00;
    for (uVar14 = 0; (psVar3 = plVar15->head, psVar3 != (sendContext *)0x0 && (uVar14 < 0x80));
        uVar14 = uVar14 + 1) {
      sVar4 = psVar3->len;
      *psVar8 = sVar4;
      ((iovec *)(psVar8 + -1))->iov_base = psVar3->ptr;
      iVar12 = iVar12 + (int)sVar4;
      plVar15 = (linklist *)&psVar3->next;
      psVar8 = psVar8 + 2;
    }
    do {
      sVar9 = writev(this->fd,(iovec *)this->send_iovec,(int)uVar14);
      if (sVar9 != -1) break;
      piVar11 = __errno_location();
    } while (*piVar11 == 4);
    uVar13 = (uint)sVar9;
    if ((psVar3 == (sendContext *)0x0) && (iVar12 <= (int)uVar13)) {
      linklist::clear(this_00);
    }
    std::mutex::lock(__mutex);
    cVar1 = this->closedOnFlush;
    if ((int)uVar13 < 0) {
      piVar11 = __errno_location();
      if (*piVar11 == 0xb) {
        linklist::add_front(this->ptrSendlist,this_00);
        iVar12 = 0;
        iVar6 = 0;
        if (this->writeableVer == iVar2) {
          this->writeable = false;
          bVar7 = true;
        }
        else {
LAB_0011b477:
          iVar12 = iVar6;
          bVar7 = false;
        }
      }
      else {
        bVar7 = false;
        iVar12 = 0;
        if (((this->closed)._M_base._M_i & 1U) == 0) {
          std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator=
                    ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                     &flushCallback._M_invoker,&this->errorCallback_);
          this->socketError = true;
          this->err = *piVar11;
          iVar6 = 3;
          goto LAB_0011b477;
        }
      }
    }
    else {
      if (this->sendTimeout != 0) {
        rVar10 = std::chrono::_V2::steady_clock::now();
        (this->lastSendTime).__d.__r = rVar10;
      }
      if ((uVar13 != 0) &&
         (uVar14 = (ulong)(uVar13 & 0x7fffffff),
         psVar3 != (sendContext *)0x0 || (int)uVar13 < iVar12)) {
        while( true ) {
          psVar3 = this_00->head;
          uVar5 = psVar3->len;
          if (uVar14 < uVar5) break;
          linklist::pop_front(this_00);
          uVar14 = uVar14 - uVar5;
        }
        psVar3->ptr = psVar3->ptr + uVar14;
        psVar3->len = uVar5 - uVar14;
        linklist::add_front(this->ptrSendlist,this_00);
      }
      this->bytes4Send = this->bytes4Send - (ulong)(uVar13 & 0x7fffffff);
      bVar7 = false;
      iVar12 = 0;
      if (this->ptrSendlist->head == (sendContext *)0x0) {
        if (this->shutdown == true) {
          shutdown(this->fd,1);
        }
        if ((this->flushCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
          std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
                    ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)auStack_c8,
                     &this->flushCallback_);
          iVar6 = 2;
          goto LAB_0011b477;
        }
        bVar7 = false;
        iVar12 = 0;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if (bVar7) {
    this_01 = this->poller_;
    std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPSocket,void>
              ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_d8,
               (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPSocket>);
    local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(local_d8 + 8);
    if (local_d8 == 0) {
      local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Stack_d0._M_pi;
    local_d8 = 0;
    _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Poller::Enable(this_01,&local_40,4);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  }
  if (iVar12 == 3) {
    if (errorCallback.super__Function_base._M_functor._8_8_ != 0) {
      std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPSocket,void>
                ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                 (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPSocket>);
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::operator()
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> *)
                 &flushCallback._M_invoker,(shared_ptr<hwnet::TCPSocket> *)&local_40,this->err);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      goto LAB_0011b5c0;
    }
  }
  else {
    if (iVar12 != 2) goto LAB_0011b5c0;
    if (flushCallback.super__Function_base._M_functor._8_8_ != 0) {
      std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::TCPSocket,void>
                ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)&local_40,
                 (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<hwnet::TCPSocket>);
      std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator()
                ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)auStack_c8,
                 (shared_ptr<hwnet::TCPSocket> *)&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    if (cVar1 == '\0') goto LAB_0011b5c0;
  }
  Close(this);
LAB_0011b5c0:
  std::_Function_base::~_Function_base((_Function_base *)&errorCallback._M_invoker);
  std::_Function_base::~_Function_base((_Function_base *)&flushCallback._M_invoker);
  std::_Function_base::~_Function_base((_Function_base *)auStack_c8);
  return;
}

Assistant:

void TCPSocket::sendInWorker() {
	
	auto cb = nothing;

	FlushCallback flushCallback = nullptr;
	ErrorCallback errorCallback = nullptr;
	HighWaterCallback highWaterCallback = nullptr;
	size_t bytes4Send_ = 0;
	auto closedOnFlush_ = false;
	auto enableWrite = false;//是否需要调用Enable(Write)


	this->mtx.lock();

	
	if(!this->canWrite()){
		this->mtx.unlock();
		return; 
	} else {
		if(!this->writeable && this->highWater()) {
			cb = callHighwaterCallback;
			bytes4Send_ = this->bytes4Send;
			highWaterCallback = this->highWaterCallback_;
		} else {
			auto localSendlist = this->ptrSendlist;
			auto localVer = this->writeableVer;
			this->slistIdx = this->slistIdx == 0 ? 1 : 0;
			this->ptrSendlist = &this->sendLists[this->slistIdx]; 

			this->mtx.unlock();

			auto c   = 0;
			auto totalBytes = 0;
			auto cur =  localSendlist->head;
			for( ; cur != nullptr && c < max_send_iovec_size; cur = cur->next,++c) {
				send_iovec[c].iov_len = cur->len;
				send_iovec[c].iov_base = cur->ptr;
				totalBytes += cur->len;			
			}

			int n = TEMP_FAILURE_RETRY(::writev(this->fd,&this->send_iovec[0],c));

			if(n >= totalBytes && cur == nullptr){
				localSendlist->clear();
			}

			this->mtx.lock();

			closedOnFlush_ = this->closedOnFlush;

			if(n >= 0) {

				if(this->sendTimeout > 0) {
					this->lastSendTime = std::chrono::steady_clock::now();
				}

				if(n > 0 && (n < totalBytes || cur != nullptr)) {
					//部分发送
					size_t nn = (size_t)n;
					for( ; ; ) {
						auto front = localSendlist->front();
						if(nn >= front->len) {
							nn -= front->len;
							localSendlist->pop_front();
						} else {
							front->ptr += nn;
							front->len -= nn;
							break;
						}
					}
					this->ptrSendlist->add_front(localSendlist);
				}

				this->bytes4Send -= n;
				if(this->ptrSendlist->empty()){
					if(this->shutdown){
						::shutdown(this->fd,SHUT_WR);
					}
					if(this->flushCallback_) {
						flushCallback = this->flushCallback_;
						cb = callFlushCallback;
					}
				}

			} else {
				if(n < 0 && errno == EAGAIN) {
					this->ptrSendlist->add_front(localSendlist);
					if(this->writeableVer == localVer) {
						this->writeable = false;
						enableWrite = true;				
					}
				} else {
					if(!this->closed){
						errorCallback = this->errorCallback_;
						this->socketError = true;
						this->err = errno;
						cb = callErrorCallback;
					}
				}
			}
		}
	}


	this->mtx.unlock();

	if(enableWrite) {
		this->poller_->Enable(shared_from_this(),Poller::Write);
	}

	switch(cb){
		case callHighwaterCallback:{
			if(highWaterCallback){
				highWaterCallback(shared_from_this(),bytes4Send_);
			}			
		}
		break;
		case callFlushCallback:{
			if(flushCallback){
				flushCallback(shared_from_this());
			}
			if(closedOnFlush_){
				this->Close();
			}			
		}
		break;
		case callErrorCallback:{
			if(errorCallback) {
				errorCallback(shared_from_this(),err);
			} else {
				this->Close();
			}				
		}
		break;
		default:{
			return;
		}
	}
}